

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O1

int bmp_read_direct(gdImagePtr im,gdIOCtxPtr infile,bmp_info_t *info,bmp_hdr_t *header)

{
  uint y;
  short sVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  short sVar5;
  int iVar6;
  uint *result;
  short data;
  int blue;
  int green;
  int red;
  int alpha;
  ushort local_52;
  int local_50;
  uint local_4c;
  uint local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  gdImagePtr local_38;
  
  local_3c = 0;
  local_48 = 0;
  local_4c = 0;
  local_50 = 0;
  local_52 = 0;
  iVar2 = info->enctype;
  if (iVar2 != 0) {
    if (iVar2 == 2) {
      if (info->depth != 4) {
        return 1;
      }
    }
    else {
      if (iVar2 != 1) {
        return 1;
      }
      if (info->depth != 8) {
        return 1;
      }
    }
  }
  local_38 = im;
  lVar4 = gdTell(infile);
  if ((lVar4 != header->off) && (iVar2 = gdSeek(infile,header->off), iVar2 == 0)) {
    return 1;
  }
  iVar2 = info->height;
  sVar1 = (short)*(undefined4 *)&info->depth;
  sVar5 = sVar1 + 7;
  if (-1 < sVar1) {
    sVar5 = sVar1;
  }
  iVar3 = (((int)sVar5 >> 3) * info->width) % 4;
  iVar6 = 4 - iVar3;
  if (iVar3 == 0) {
    iVar6 = 0;
  }
  if (iVar2 < 1) {
    return 0;
  }
  local_44 = iVar6 + 1;
  local_40 = 0;
  do {
    y = ~local_40 + iVar2;
    if (info->topdown != '\0') {
      y = local_40;
    }
    if (0 < info->width) {
      iVar2 = 0;
      do {
        if (info->depth == 0x18) {
          iVar3 = gdGetByte(&local_50,infile);
          if (iVar3 == 0) {
            return 1;
          }
          iVar3 = gdGetByte((int *)&local_4c,infile);
          result = &local_48;
          if (iVar3 == 0) {
            return 1;
          }
LAB_001128ac:
          iVar3 = gdGetByte((int *)result,infile);
          if (iVar3 == 0) {
            return 1;
          }
        }
        else {
          if (info->depth != 0x10) {
            iVar3 = gdGetByte(&local_50,infile);
            if (iVar3 == 0) {
              return 1;
            }
            iVar3 = gdGetByte((int *)&local_4c,infile);
            if (iVar3 == 0) {
              return 1;
            }
            iVar3 = gdGetByte((int *)&local_48,infile);
            if (iVar3 == 0) {
              return 1;
            }
            result = &local_3c;
            goto LAB_001128ac;
          }
          iVar3 = gdGetWordLSB((short *)&local_52,infile);
          if (iVar3 == 0) {
            return 1;
          }
          local_48 = local_52 >> 7 & 0xf8;
          local_4c = local_52 >> 2 & 0xf8;
          local_50 = (local_52 & 0x1f) << 3;
        }
        gdImageSetPixel(local_38,iVar2,y,local_4c * 0x100 + local_48 * 0x10000 + local_50);
        iVar2 = iVar2 + 1;
      } while (iVar2 < info->width);
    }
    iVar2 = local_44;
    if (0 < iVar6) {
      do {
        iVar3 = gdGetByte((int *)&local_48,infile);
        if (iVar3 == 0) {
          return 1;
        }
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
    }
    local_40 = local_40 + 1;
    iVar2 = info->height;
    if (iVar2 <= (int)local_40) {
      return 0;
    }
  } while( true );
}

Assistant:

static int bmp_read_direct(gdImagePtr im, gdIOCtxPtr infile, bmp_info_t *info, bmp_hdr_t *header)
{
	int ypos = 0, xpos = 0, row = 0;
	int padding = 0, alpha = 0, red = 0, green = 0, blue = 0;
	signed short int data = 0;

	switch(info->enctype) {
	case BMP_BI_RGB:
		/* no-op */
		break;

	case BMP_BI_BITFIELDS:
		if (info->depth == 24) {
			BMP_DEBUG(printf("Bitfield compression isn't supported for 24-bit\n"));
			return 1;
		}
		BMP_DEBUG(printf("Currently no bitfield support\n"));
		return 1;
		break;

	case BMP_BI_RLE8:
		if (info->depth != 8) {
			BMP_DEBUG(printf("RLE is only valid for 8-bit images\n"));
			return 1;
		}
		break;
	case BMP_BI_RLE4:
		if (info->depth != 4) {
			BMP_DEBUG(printf("RLE is only valid for 4-bit images\n"));
			return 1;
		}
		break;
	case BMP_BI_JPEG:
	case BMP_BI_PNG:
	default:
		BMP_DEBUG(printf("Unsupported BMP compression format\n"));
		return 1;
	}

	/* There is a chance the data isn't until later, would be weird but it is possible */
	if (gdTell(infile) != header->off) {
		/* Should make sure we don't seek past the file size */
		if (!gdSeek(infile, header->off)) {
			return 1;
		}
	}

	/* The line must be divisible by 4, else its padded with NULLs */
	padding = ((int)(info->depth / 8) * info->width) % 4;
	if (padding) {
		padding = 4 - padding;
	}


	for (ypos = 0; ypos < info->height; ++ypos) {
		if (info->topdown) {
			row = ypos;
		} else {
			row = info->height - ypos - 1;
		}

		for (xpos = 0; xpos < info->width; xpos++) {
			if (info->depth == 16) {
				if (!gdGetWordLSB(&data, infile)) {
					return 1;
				}
				BMP_DEBUG(printf("Data: %X\n", data));
				red = ((data & 0x7C00) >> 10) << 3;
				green = ((data & 0x3E0) >> 5) << 3;
				blue = (data & 0x1F) << 3;
				BMP_DEBUG(printf("R: %d, G: %d, B: %d\n", red, green, blue));
			} else if (info->depth == 24) {
				if (!gdGetByte(&blue, infile) || !gdGetByte(&green, infile) || !gdGetByte(&red, infile)) {
					return 1;
				}
			} else {
				if (!gdGetByte(&blue, infile) || !gdGetByte(&green, infile) || !gdGetByte(&red, infile) || !gdGetByte(&alpha, infile)) {
					return 1;
				}
			}
			/*alpha = gdAlphaMax - (alpha >> 1);*/
			gdImageSetPixel(im, xpos, row, gdTrueColor(red, green, blue));
		}
		for (xpos = padding; xpos > 0; --xpos) {
			if (!gdGetByte(&red, infile)) {
				return 1;
			}
		}
	}

	return 0;
}